

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::PartitionedColumnData::Append
          (PartitionedColumnData *this,PartitionedColumnDataAppendState *state,DataChunk *input)

{
  int iVar1;
  undefined4 extraout_var;
  idx_t iVar2;
  reference this_00;
  type this_01;
  reference this_02;
  type state_00;
  undefined4 extraout_var_00;
  optional_idx partition_index;
  optional_idx local_28;
  
  (*this->_vptr_PartitionedColumnData[4])();
  BuildPartitionSel(this,state,input->count);
  iVar1 = (*this->_vptr_PartitionedColumnData[5])(this);
  local_28 = PartitionedColumnDataAppendState::GetPartitionIndexIfSinglePartition
                       (state,CONCAT44(extraout_var,iVar1) < 0x100);
  if (local_28.index != 0xffffffffffffffff) {
    iVar2 = optional_idx::GetIndex(&local_28);
    this_00 = vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
              ::get<true>(&this->partitions,iVar2);
    this_01 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              ::operator*(this_00);
    iVar2 = optional_idx::GetIndex(&local_28);
    this_02 = vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_true>
              ::get<true>(&state->partition_append_states,iVar2);
    state_00 = unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>
               ::operator*(this_02);
    ColumnDataCollection::Append(this_01,state_00,input);
    return;
  }
  iVar1 = (*this->_vptr_PartitionedColumnData[5])(this);
  if (CONCAT44(extraout_var_00,iVar1) < 0x100) {
    AppendInternal<true>(this,state,input);
    return;
  }
  AppendInternal<false>(this,state,input);
  return;
}

Assistant:

void PartitionedColumnData::Append(PartitionedColumnDataAppendState &state, DataChunk &input) {
	// Compute partition indices and store them in state.partition_indices
	ComputePartitionIndices(state, input);

	// Build the selection vector for the partitions
	BuildPartitionSel(state, input.size());

	// Early out: check if everything belongs to a single partition
	const auto partition_index = state.GetPartitionIndexIfSinglePartition(UseFixedSizeMap());
	if (partition_index.IsValid()) {
		auto &partition = *partitions[partition_index.GetIndex()];
		auto &partition_append_state = *state.partition_append_states[partition_index.GetIndex()];
		partition.Append(partition_append_state, input);
		return;
	}

	if (UseFixedSizeMap()) {
		AppendInternal<true>(state, input);
	} else {
		AppendInternal<false>(state, input);
	}
}